

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O3

void asio::detail::
     completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1335:26),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  undefined1 *puVar1;
  code *pcVar2;
  undefined8 uVar3;
  ptr p;
  ptr local_80;
  undefined1 local_68 [48];
  scheduler_operation *local_38;
  func_type p_Stack_30;
  code *local_28;
  scheduler_operation *local_20;
  
  local_68._0_8_ = base[1].next_;
  local_68._8_8_ = base[1].func_;
  base[1].func_ = (func_type)0x0;
  puVar1 = local_68 + 0x30;
  base[1].next_ = (scheduler_operation *)0x0;
  local_68._16_8_ = *(undefined8 *)&base[1].task_result_;
  local_68._24_8_ = base[2].next_;
  base[2].next_ = (scheduler_operation *)0x0;
  *(undefined8 *)&base[1].task_result_ = 0;
  local_68._32_8_ = base[2].func_;
  local_68._40_8_ = *(undefined8 *)&base[2].task_result_;
  *(undefined8 *)&base[2].task_result_ = 0;
  base[2].func_ = (func_type)0x0;
  local_28 = (code *)0x0;
  local_38 = (scheduler_operation *)0x0;
  p_Stack_30 = (func_type)0x0;
  local_20 = base[4].next_;
  pcVar2 = *(code **)&base[3].task_result_;
  if (pcVar2 != (code *)0x0) {
    local_38 = base[3].next_;
    p_Stack_30 = base[3].func_;
    *(undefined8 *)&base[3].task_result_ = 0;
    base[4].next_ = (scheduler_operation *)0x0;
    local_28 = pcVar2;
  }
  local_80.h = (anon_class_80_4_80d670d3_for_handler_ *)local_68;
  local_80.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1335:26),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)base;
  local_80.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1335:26),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)base;
  ptr::reset(&local_80);
  if (owner != (void *)0x0) {
    if (local_28 == (code *)0x0) {
      uVar3 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar3);
    }
    (*(code *)local_20)(puVar1);
    std::ostream::write((char *)(local_68._32_8_ + 0x10),*(long *)local_68._16_8_);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(puVar1,puVar1,3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._40_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._40_8_);
  }
  if ((scheduler_operation *)local_68._24_8_ != (scheduler_operation *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._24_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  ptr::reset(&local_80);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };

    ASIO_HANDLER_COMPLETION((*h));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        ASIO_MOVE_CAST2(handler_work<Handler, IoExecutor>)(
          h->work_));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }